

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodExceptionTextTest.cpp
# Opt level: O1

void __thiscall MethodExceptionTextTest::MethodExceptionTextTest(MethodExceptionTextTest *this)

{
  undefined1 local_81;
  shared_ptr<oout::EqualMatch> local_80;
  shared_ptr<oout::MethodExceptionText> local_70;
  shared_ptr<const_oout::NamedTest> local_60;
  shared_ptr<WithExceptionInMethod> local_50;
  string local_40;
  code *local_20;
  undefined8 local_18;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Exception in method represent as a text","");
  local_20 = WithExceptionInMethod::failure;
  local_18 = 0;
  local_50.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_50.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_50.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_50.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_50.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00198390;
  local_50.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_50.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_70.super___shared_ptr<oout::MethodExceptionText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::MethodExceptionText,std::allocator<oout::MethodExceptionText>,void(WithExceptionInMethod::*)(std::__cxx11::string_const&)const,std::shared_ptr<WithExceptionInMethod>,char_const(&)[8]>
            (&local_70.super___shared_ptr<oout::MethodExceptionText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(MethodExceptionText **)&local_70,
             (allocator<oout::MethodExceptionText> *)&local_80,
             (offset_in_WithExceptionInMethod_to_subr *)&local_20,&local_50,(char (*) [8])"no fate")
  ;
  local_80.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualMatch,std::allocator<oout::EqualMatch>,char_const(&)[8]>
            (&local_80.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualMatch **)&local_80,(allocator<oout::EqualMatch> *)&local_81,
             (char (*) [8])"no fate");
  local_60.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[46],std::shared_ptr<oout::MethodExceptionText>,std::shared_ptr<oout::EqualMatch>>
            (&local_60.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_60,(allocator<oout::NamedTest> *)&local_81,
             (char (*) [46])"MethodExceptionText catch exception as a text",&local_70,&local_80);
  oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_40,&local_60);
  if (local_60.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_80.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_70.super___shared_ptr<oout::MethodExceptionText,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<oout::MethodExceptionText,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_50.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00198350;
  return;
}

Assistant:

MethodExceptionTextTest::MethodExceptionTextTest()
: dirty::Test(
	"Exception in method represent as a text",
	make_shared<const NamedTest>(
		"MethodExceptionText catch exception as a text",
		make_shared<MethodExceptionText>(
			&WithExceptionInMethod::failure,
			make_shared<WithExceptionInMethod>(),
			"no fate"
		),
		make_shared<EqualMatch>("no fate")
	)
)
{
}